

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
::write_pointer<unsigned_long>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
           *this,unsigned_long value,format_specs *specs)

{
  format_specs specs_copy;
  pointer_writer<unsigned_long> pw;
  checked_ptr<typename_buffer<char>::value_type> local_38;
  ulong uStack_30;
  pointer_writer<unsigned_long> local_28;
  
  local_28.num_digits = count_digits<4u,unsigned_long>(value);
  local_28.value = value;
  if (specs == (format_specs *)0x0) {
    local_38 = reserve<fmt::v6::internal::buffer<char>,_0>
                         (&this->out_,(ulong)(local_28.num_digits + 2));
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
    ::pointer_writer<unsigned_long>::operator()
              ((pointer_writer<unsigned_long> *)&local_28,&local_38);
  }
  else {
    local_38 = *(checked_ptr<typename_buffer<char>::value_type> *)specs;
    uStack_30._0_1_ = specs->type;
    uStack_30._1_1_ = specs->field_0x9;
    uStack_30._2_6_ = specs->fill;
    if ((uStack_30 & 0xf00) == 0) {
      uStack_30 = uStack_30 | 0x200;
    }
    basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
    ::
    write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::pointer_writer<unsigned_long>&>
              ((basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                *)this,(format_specs *)&local_38,&local_28);
  }
  return;
}

Assistant:

void write_pointer(UIntPtr value, const format_specs* specs) {
    int num_digits = count_digits<4>(value);
    auto pw = pointer_writer<UIntPtr>{value, num_digits};
    if (!specs) return pw(reserve(to_unsigned(num_digits) + 2));
    format_specs specs_copy = *specs;
    if (specs_copy.align == align::none) specs_copy.align = align::right;
    write_padded(specs_copy, pw);
  }